

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O2

void Eigen::internal::
     dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_-1,_0,_3,_1>_>_>,_Eigen::internal::mul_assign_op<double,_double>,_0>,_0,_0>
     ::run(generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,_3,_1>_>_>,_Eigen::internal::mul_assign_op<double,_double>,_0>
           *kernel)

{
  DstXprType *pDVar1;
  DstEvaluatorType *pDVar2;
  SrcEvaluatorType *pSVar3;
  PointerType pdVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  Index col;
  long lVar8;
  long lVar9;
  
  pDVar1 = kernel->m_dstExpr;
  lVar5 = (pDVar1->
          super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>).
          super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_0>.m_cols
          .m_value;
  if (lVar5 < 1) {
    lVar5 = 0;
  }
  lVar7 = 0;
  for (lVar8 = 0; lVar8 != lVar5; lVar8 = lVar8 + 1) {
    lVar9 = (pDVar1->
            super_BlockImpl<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_Eigen::Dense>).
            super_BlockImpl_dense<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_1>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_0>.
            m_rows.m_value;
    pDVar2 = kernel->m_dst;
    pSVar3 = kernel->m_src;
    lVar6 = lVar7;
    if (lVar9 < 1) {
      lVar9 = 0;
    }
    while (lVar9 != 0) {
      pdVar4 = (pDVar2->
               super_block_evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false,_true>).
               super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,_3,_1>_>
               .m_data;
      *(double *)((long)pdVar4 + lVar6) =
           (pSVar3->m_functor).m_other * *(double *)((long)pdVar4 + lVar6);
      lVar6 = lVar6 + 8;
      lVar9 = lVar9 + -1;
    }
    lVar7 = lVar7 + 0x18;
  }
  return;
}

Assistant:

EIGEN_STRONG_INLINE run(Kernel &kernel)
  {
    for(Index outer = 0; outer < kernel.outerSize(); ++outer) {
      for(Index inner = 0; inner < kernel.innerSize(); ++inner) {
        kernel.assignCoeffByOuterInner(outer, inner);
      }
    }
  }